

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  int *comp_00;
  stbi__uint32 b;
  stbi__uint32 c;
  int iVar1;
  int iVar2;
  uchar *puVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  comp_00 = &s->img_n;
  iVar1 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,comp_00);
  if (iVar1 != 0) {
    *x = s->img_x;
    *y = s->img_y;
    if (comp != (int *)0x0) {
      *comp = *comp_00;
    }
    iVar1 = s->img_n;
    b = s->img_x;
    c = s->img_y;
    iVar2 = stbi__mad3sizes_valid(iVar1,b,c,0);
    if (iVar2 == 0) {
      pcVar4 = "too large";
    }
    else {
      puVar3 = (uchar *)stbi__malloc_mad3(iVar1,b,c,0);
      if (puVar3 != (uchar *)0x0) {
        stbi__getn(s,puVar3,b * iVar1 * c);
        if (req_comp == 0) {
          return puVar3;
        }
        if (*comp_00 == req_comp) {
          return puVar3;
        }
        puVar3 = stbi__convert_format(puVar3,*comp_00,req_comp,s->img_x,s->img_y);
        return puVar3;
      }
      pcVar4 = "outofmem";
    }
    *(char **)(in_FS_OFFSET + -0x10) = pcVar4;
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   if (!stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n))
      return 0;

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad3sizes_valid(s->img_n, s->img_x, s->img_y, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad3(s->img_n, s->img_x, s->img_y, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y);

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}